

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::copyAppend
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,Output *b,Output *e)

{
  qsizetype *pqVar1;
  Output *pOVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  qreal qVar7;
  qreal qVar8;
  drmModePropertyPtr p_Var9;
  drmModePropertyBlobPtr p_Var10;
  QKmsPlane *pQVar11;
  QSize QVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  Output *pOVar16;
  int iVar17;
  bool bVar18;
  undefined7 uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  undefined4 uVar23;
  undefined3 uVar24;
  bool bVar25;
  bool bVar26;
  undefined3 uVar27;
  QImage *pQVar28;
  long lVar29;
  QImage *this_00;
  QImage *pQVar30;
  
  if ((b != e) && (b < e)) {
    pOVar2 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
    pQVar28 = &b->fb[0].wrapper;
    do {
      lVar3 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
      pDVar4 = (b->kmsOutput).name.d.d;
      pOVar2[lVar3].kmsOutput.name.d.d = pDVar4;
      pOVar2[lVar3].kmsOutput.name.d.ptr = (b->kmsOutput).name.d.ptr;
      pOVar2[lVar3].kmsOutput.name.d.size = (b->kmsOutput).name.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar4->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pOVar2[lVar3].kmsOutput.saved_crtc = (b->kmsOutput).saved_crtc;
      uVar20 = (b->kmsOutput).connector_id;
      uVar21 = (b->kmsOutput).crtc_index;
      uVar22 = (b->kmsOutput).crtc_id;
      uVar23 = *(undefined4 *)&(b->kmsOutput).field_0x24;
      qVar7 = (b->kmsOutput).physical_size.wd;
      qVar8 = (b->kmsOutput).physical_size.ht;
      iVar17 = (b->kmsOutput).mode;
      bVar18 = (b->kmsOutput).mode_set;
      uVar19 = *(undefined7 *)&(b->kmsOutput).field_0x41;
      pOVar2[lVar3].kmsOutput.preferred_mode = (b->kmsOutput).preferred_mode;
      pOVar2[lVar3].kmsOutput.mode = iVar17;
      pOVar2[lVar3].kmsOutput.mode_set = bVar18;
      *(undefined7 *)&pOVar2[lVar3].kmsOutput.field_0x41 = uVar19;
      pOVar2[lVar3].kmsOutput.physical_size.wd = qVar7;
      pOVar2[lVar3].kmsOutput.physical_size.ht = qVar8;
      pOVar2[lVar3].kmsOutput.connector_id = uVar20;
      pOVar2[lVar3].kmsOutput.crtc_index = uVar21;
      pOVar2[lVar3].kmsOutput.crtc_id = uVar22;
      *(undefined4 *)&pOVar2[lVar3].kmsOutput.field_0x24 = uVar23;
      pDVar5 = (b->kmsOutput).modes.d.d;
      pOVar2[lVar3].kmsOutput.modes.d.d = pDVar5;
      pOVar2[lVar3].kmsOutput.modes.d.ptr = (b->kmsOutput).modes.d.ptr;
      pOVar2[lVar3].kmsOutput.modes.d.size = (b->kmsOutput).modes.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar17 = (b->kmsOutput).subpixel;
      uVar23 = *(undefined4 *)&(b->kmsOutput).field_0x6c;
      p_Var9 = (b->kmsOutput).dpms_prop;
      p_Var10 = (b->kmsOutput).edid_blob;
      bVar26 = (b->kmsOutput).wants_forced_plane;
      uVar27 = *(undefined3 *)&(b->kmsOutput).field_0x81;
      uVar22 = (b->kmsOutput).forced_plane_id;
      uVar20 = (b->kmsOutput).forced_plane_id;
      bVar18 = (b->kmsOutput).forced_plane_set;
      uVar24 = *(undefined3 *)&(b->kmsOutput).field_0x89;
      uVar21 = (b->kmsOutput).drm_format;
      bVar25 = (b->kmsOutput).drm_format_requested_by_user;
      pOVar16 = pOVar2 + lVar3;
      *(undefined3 *)&(pOVar16->kmsOutput).field_0x81 = *(undefined3 *)&(b->kmsOutput).field_0x81;
      (pOVar16->kmsOutput).forced_plane_id = uVar20;
      (pOVar16->kmsOutput).forced_plane_set = bVar18;
      pOVar16 = pOVar2 + lVar3;
      *(undefined3 *)&(pOVar16->kmsOutput).field_0x89 = uVar24;
      (pOVar16->kmsOutput).drm_format = uVar21;
      (pOVar16->kmsOutput).drm_format_requested_by_user = bVar25;
      pOVar2[lVar3].kmsOutput.edid_blob = p_Var10;
      pOVar16 = pOVar2 + lVar3;
      (pOVar16->kmsOutput).wants_forced_plane = bVar26;
      *(undefined3 *)&(pOVar16->kmsOutput).field_0x81 = uVar27;
      (pOVar16->kmsOutput).forced_plane_id = uVar22;
      pOVar2[lVar3].kmsOutput.subpixel = iVar17;
      *(undefined4 *)&pOVar2[lVar3].kmsOutput.field_0x6c = uVar23;
      pOVar2[lVar3].kmsOutput.dpms_prop = p_Var9;
      pDVar4 = (b->kmsOutput).clone_source.d.d;
      pOVar2[lVar3].kmsOutput.clone_source.d.d = pDVar4;
      pOVar2[lVar3].kmsOutput.clone_source.d.ptr = (b->kmsOutput).clone_source.d.ptr;
      pOVar2[lVar3].kmsOutput.clone_source.d.size = (b->kmsOutput).clone_source.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (b->kmsOutput).available_planes.d.d;
      pOVar2[lVar3].kmsOutput.available_planes.d.d = pDVar6;
      pOVar2[lVar3].kmsOutput.available_planes.d.ptr = (b->kmsOutput).available_planes.d.ptr;
      pOVar2[lVar3].kmsOutput.available_planes.d.size = (b->kmsOutput).available_planes.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar11 = (b->kmsOutput).eglfs_plane;
      QVar12 = (b->kmsOutput).size;
      uVar20 = (b->kmsOutput).modeIdPropertyId;
      uVar21 = (b->kmsOutput).activePropertyId;
      uVar22 = (b->kmsOutput).mode_blob_id;
      pOVar2[lVar3].kmsOutput.crtcIdPropertyId = (b->kmsOutput).crtcIdPropertyId;
      pOVar2[lVar3].kmsOutput.modeIdPropertyId = uVar20;
      pOVar2[lVar3].kmsOutput.activePropertyId = uVar21;
      pOVar2[lVar3].kmsOutput.mode_blob_id = uVar22;
      pOVar2[lVar3].kmsOutput.eglfs_plane = pQVar11;
      pOVar2[lVar3].kmsOutput.size = QVar12;
      this_00 = &pOVar2[lVar3].fb[0].wrapper;
      lVar29 = 2;
      pQVar30 = pQVar28;
      do {
        uVar13 = *(undefined8 *)(pQVar30 + -0x20);
        uVar14 = *(undefined8 *)(pQVar30 + -0x18);
        uVar15 = *(undefined8 *)(pQVar30 + -8);
        *(undefined8 *)(this_00 + -0x10) = *(undefined8 *)(pQVar30 + -0x10);
        *(undefined8 *)(this_00 + -8) = uVar15;
        *(undefined8 *)(this_00 + -0x20) = uVar13;
        *(undefined8 *)(this_00 + -0x18) = uVar14;
        QImage::QImage(this_00,pQVar30);
        pQVar30 = pQVar30 + 0x38;
        this_00 = this_00 + 0x38;
        lVar29 = lVar29 + -1;
      } while (lVar29 != 0);
      lVar29 = 0x158;
      do {
        QRegion::QRegion((QRegion *)((long)&pOVar2[lVar3].kmsOutput.name.d.d + lVar29),
                         (QRegion *)((long)&(b->kmsOutput).name.d.d + lVar29));
        lVar29 = lVar29 + 8;
      } while (lVar29 != 0x168);
      pOVar2[lVar3].flipped = b->flipped;
      pOVar2[lVar3].backFb = b->backFb;
      pqVar1 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
      pQVar28 = pQVar28 + 0x170;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }